

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

DiffuseMaterial *
pbrt::DiffuseMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DiffuseMaterial *pDVar3;
  uintptr_t iptr;
  SpectrumTextureHandle reflectance;
  FloatTextureHandle displacement;
  FloatTextureHandle sigma;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_68 [2];
  long local_58 [2];
  undefined1 local_48 [16];
  ParameterDictionary *local_38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *local_30;
  undefined4 extraout_var_01;
  
  local_68[0].bits = (uintptr_t)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"reflectance","");
  local_30 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
              *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_48,(string *)parameters,(SpectrumHandle *)local_68,
             (SpectrumType)&local_30,(Allocator)0x0);
  if ((long *)local_68[0].bits != local_58) {
    operator_delete((void *)local_68[0].bits,local_58[0] + 1);
  }
  if ((local_48._0_8_ & 0xffffffffffff) == 0) {
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f000000;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
    local_48._0_8_ = CONCAT44(extraout_var_00,iVar2) | 0x7000000000000;
    *(ulong *)CONCAT44(extraout_var_00,iVar2) = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  }
  local_68[0].bits = (uintptr_t)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"sigma","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_38,(string *)parameters,0.0,
             (memory_resource *)local_68);
  if ((long *)local_68[0].bits != local_58) {
    operator_delete((void *)local_68[0].bits,local_58[0] + 1);
  }
  local_68[0].bits = (uintptr_t)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"displacement","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_48 + 8),(string *)parameters,
             (memory_resource *)local_68);
  if ((long *)local_68[0].bits != local_58) {
    operator_delete((void *)local_68[0].bits,local_58[0] + 1);
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pDVar3 = (DiffuseMaterial *)CONCAT44(extraout_var_01,iVar1);
  (pDVar3->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_48._8_8_;
  (pDVar3->reflectance).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_48._0_8_;
  (pDVar3->sigma).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_38;
  return pDVar3;
}

Assistant:

DiffuseMaterial *DiffuseMaterial::Create(const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Reflectance, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));
    FloatTextureHandle sigma = parameters.GetFloatTexture("sigma", 0.f, alloc);
    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    return alloc.new_object<DiffuseMaterial>(reflectance, sigma, displacement);
}